

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O0

void __thiscall QCompleter::setFilterMode(QCompleter *this,MatchFlags filterMode)

{
  long lVar1;
  bool bVar2;
  QCompleterPrivate *this_00;
  QFlagsStorage<Qt::MatchFlag> in_ESI;
  char *in_RDI;
  long in_FS_OFFSET;
  QCompleterPrivate *d;
  undefined7 in_stack_ffffffffffffffa8;
  bool bVar3;
  QMessageLogger *in_stack_ffffffffffffffc0;
  QFlagsStorage<Qt::MatchFlag> in_stack_ffffffffffffffe0;
  QFlagsStorage<Qt::MatchFlag> in_stack_ffffffffffffffe4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QCompleter *)0xa6e879);
  bVar2 = ::operator==((QFlags<Qt::MatchFlag>)
                       (this_00->filterMode).super_QFlagsStorageHelper<Qt::MatchFlag,_4>.
                       super_QFlagsStorage<Qt::MatchFlag>.i,(QFlags<Qt::MatchFlag>)in_ESI.i);
  if (!bVar2) {
    bVar2 = ::operator!=((QFlagsStorageHelper<Qt::MatchFlag,_4>)SUB84((ulong)in_RDI >> 0x20,0),
                         (MatchFlag)this_00);
    bVar3 = false;
    if (bVar2) {
      in_stack_ffffffffffffffe4.i = in_ESI.i;
      bVar2 = ::operator!=((QFlagsStorageHelper<Qt::MatchFlag,_4>)SUB84((ulong)in_RDI >> 0x20,0),
                           (MatchFlag)this_00);
      bVar3 = false;
      if (bVar2) {
        in_stack_ffffffffffffffe0.i = in_ESI.i;
        bVar3 = ::operator!=((QFlagsStorageHelper<Qt::MatchFlag,_4>)SUB84((ulong)in_RDI >> 0x20,0),
                             (MatchFlag)this_00);
      }
    }
    if (bVar3 == false) {
      (this_00->filterMode).super_QFlagsStorageHelper<Qt::MatchFlag,_4>.
      super_QFlagsStorage<Qt::MatchFlag>.i = in_ESI.i;
      QCompletionModel::createEngine
                ((QCompletionModel *)
                 CONCAT44(in_stack_ffffffffffffffe4.i,in_stack_ffffffffffffffe0.i));
      QCompletionModel::invalidate((QCompletionModel *)this_00);
    }
    else {
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffffc0,in_RDI,(int)((ulong)this_00 >> 0x20),
                 (char *)CONCAT17(bVar3,in_stack_ffffffffffffffa8));
      QMessageLogger::warning
                (&stack0xffffffffffffffc0,"Unhandled QCompleter::filterMode flag is used.");
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCompleter::setFilterMode(Qt::MatchFlags filterMode)
{
    Q_D(QCompleter);

    if (d->filterMode == filterMode)
        return;

    if (Q_UNLIKELY(filterMode != Qt::MatchStartsWith &&
                   filterMode != Qt::MatchContains &&
                   filterMode != Qt::MatchEndsWith)) {
        qWarning("Unhandled QCompleter::filterMode flag is used.");
        return;
    }

    d->filterMode = filterMode;
    d->proxy->createEngine();
    d->proxy->invalidate();
}